

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml_parser.h
# Opt level: O0

bool embree::operator<(Ref<embree::XML> *a,Ref<embree::XML> *b)

{
  bool bVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  undefined1 local_81;
  vector<embree::Ref<embree::XML>,_std::allocator<embree::Ref<embree::XML>_>_>
  *in_stack_ffffffffffffff88;
  vector<embree::Ref<embree::XML>,_std::allocator<embree::Ref<embree::XML>_>_>
  *in_stack_ffffffffffffff90;
  
  bVar1 = std::operator!=(in_RDI,in_RSI);
  if (bVar1) {
    local_81 = std::operator<(in_RDI,in_RSI);
  }
  else {
    bVar1 = std::operator!=((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)in_RDI,
                            (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)in_RSI);
    if (bVar1) {
      local_81 = std::operator<((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                 *)in_RDI,
                                (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                 *)in_RSI);
    }
    else {
      bVar1 = std::operator!=((vector<embree::Ref<embree::XML>,_std::allocator<embree::Ref<embree::XML>_>_>
                               *)in_RDI,
                              (vector<embree::Ref<embree::XML>,_std::allocator<embree::Ref<embree::XML>_>_>
                               *)in_RSI);
      if (bVar1) {
        local_81 = std::operator<(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
      }
      else {
        bVar1 = std::operator!=((vector<embree::Token,_std::allocator<embree::Token>_> *)in_RDI,
                                (vector<embree::Token,_std::allocator<embree::Token>_> *)in_RSI);
        if (bVar1) {
          local_81 = std::operator<((vector<embree::Token,_std::allocator<embree::Token>_> *)in_RSI,
                                    (vector<embree::Token,_std::allocator<embree::Token>_> *)in_RDI)
          ;
        }
        else {
          local_81 = false;
        }
      }
    }
  }
  return local_81;
}

Assistant:

bool operator <( const Ref<XML>& a, const Ref<XML>& b ) {
      if (a->name     != b->name    ) return a->name     < b->name;
      if (a->parms    != b->parms   ) return a->parms    < b->parms;
      if (a->children != b->children) return a->children < b->children;
      if (a->body     != b->body    ) return a->body     < b->body;
      return false;
    }